

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.h
# Opt level: O2

void __thiscall Professor::print(Professor *this,bool with_marks)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  std::operator<<((ostream *)&std::cout,"prof: ");
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->surname);
  std::operator<<(poVar1," ");
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->name);
  std::operator<<(poVar1," ");
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->middle_name);
  std::operator<<(poVar1," ");
  if ((int)CONCAT71(in_register_00000031,with_marks) != 0) {
    poVar1 = std::ostream::_M_insert<double>(this->knowledge);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>(this->skill);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>(this->social);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>(this->loyality);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>(this->total);
    std::operator<<(poVar1," ");
    return;
  }
  return;
}

Assistant:

void Professor::print (bool with_marks){

    std::cout << "prof: ";
    std::cout << surname << " ";
    std::cout << name << " ";
    std::cout << middle_name << " ";
    if (with_marks) {
        std::cout << knowledge << " ";
        std::cout << skill << " ";
        std::cout << social << " ";
        std::cout << loyality << " ";
        std::cout << total << " ";
    }

}